

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::anon_unknown_39::unwrapResult
               (Scope *scope,optional<slang::SourceRange> range,LookupResult *result,
               bool unwrapGenericClasses)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  string_view arg;
  string_view arg_00;
  optional<slang::SourceRange> sourceRange_04;
  bool bVar1;
  GenericClassDefSymbol *this;
  DeclaredType *this_00;
  TypeParameterSymbol *this_01;
  Type *pTVar2;
  SourceRange *pSVar3;
  Symbol *pSVar4;
  Scope *this_02;
  Symbol *pSVar5;
  byte in_DL;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  LookupResult *in_stack_00000008;
  Diagnostic *in_stack_00000010;
  SourceLocation in_stack_00000018;
  Diagnostic *diag_2;
  Scope *parent_1;
  Symbol *pkg;
  Diagnostic *diag_1;
  Symbol *parentSym;
  Scope *parent;
  GenericClassDefSymbol *genericClass;
  Diagnostic *diag;
  DeclaredType *declaredType;
  bitmask<slang::ast::LookupResultFlags> *in_stack_fffffffffffffe18;
  Diagnostic *in_stack_fffffffffffffe20;
  SourceLocation in_stack_fffffffffffffe28;
  SourceLocation noteLocation;
  undefined4 in_stack_fffffffffffffe30;
  DiagCode in_stack_fffffffffffffe34;
  LookupResult *in_stack_fffffffffffffe38;
  SourceLocation in_stack_fffffffffffffe40;
  SourceLocation in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  DiagCode DVar6;
  Diagnostic *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  Scope *in_stack_fffffffffffffe90;
  bitmask<slang::ast::LookupResultFlags> local_f9;
  undefined8 local_f8;
  undefined4 local_ec;
  SourceLocation local_e8;
  SourceLocation local_e0;
  undefined4 local_d4;
  Diagnostic *local_d0;
  Symbol *local_c8;
  Scope *local_c0;
  bitmask<slang::ast::LookupResultFlags> local_b1;
  size_t local_b0;
  char *local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  undefined4 local_8c;
  GenericClassDefSymbol *local_88;
  bitmask<slang::ast::LookupResultFlags> local_79;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  bitmask<slang::ast::LookupResultFlags> local_12;
  byte local_11;
  SourceLocation local_10;
  undefined8 local_8;
  
  local_11 = in_DL & 1;
  if (*(long *)in_RSI != 0) {
    this = (GenericClassDefSymbol *)((long)in_RSI + 0x14);
    local_10 = in_RSI;
    local_8 = in_RDI;
    bitmask<slang::ast::LookupResultFlags>::bitmask(&local_12,IsHierarchical);
    bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                      ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffe20,
                       in_stack_fffffffffffffe18);
    if ((bVar1) &&
       (this_00 = Symbol::getDeclaredType((Symbol *)in_stack_fffffffffffffe28),
       this_00 != (DeclaredType *)0x0)) {
      bVar1 = DeclaredType::isEvaluating(this_00);
      DVar6 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
      if (bVar1) {
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x64dca3);
        if (bVar1) {
          std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x64dce0);
          sourceRange.endLoc = in_stack_fffffffffffffe48;
          sourceRange.startLoc = in_stack_fffffffffffffe40;
          LookupResult::addDiag
                    (in_stack_fffffffffffffe38,
                     (Scope *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),DVar6,
                     sourceRange);
          arg._M_str = in_stack_fffffffffffffe70;
          arg._M_len = in_stack_fffffffffffffe68;
          Diagnostic::operator<<(in_stack_fffffffffffffe60,arg);
          Diagnostic::addNote(in_stack_fffffffffffffe20,in_stack_fffffffffffffe34,
                              in_stack_fffffffffffffe28);
        }
        *(long *)local_10 = 0;
        return;
      }
    }
    sourceRange_04.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
         (SourceLocation)in_stack_ffffffffffffffb8;
    sourceRange_04.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
         (SourceLocation)in_stack_ffffffffffffffb0;
    sourceRange_04.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._16_8_ = in_stack_ffffffffffffffc0;
    checkVisibility((Symbol *)in_stack_00000018,(Scope *)in_stack_00000010,sourceRange_04,
                    in_stack_00000008);
    if (**(int **)local_10 == 0x28) {
      Scope::getCompilation((Scope *)local_8);
      Compilation::noteReference
                ((Compilation *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (Symbol *)in_stack_00000018,SUB81((ulong)in_stack_00000010 >> 0x38,0));
      this_01 = Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x64de69);
      pTVar2 = TypeParameterSymbol::getTypeAlias(this_01);
      *(Type **)local_10 = pTVar2;
      bitmask<slang::ast::LookupResultFlags>::bitmask(&local_79,FromTypeParam);
      bitmask<slang::ast::LookupResultFlags>::operator|=
                ((bitmask<slang::ast::LookupResultFlags> *)((long)local_10 + 0x14),&local_79);
      noteLocation = in_stack_00000018;
    }
    else {
      noteLocation = in_stack_00000018;
      if (**(int **)local_10 == 0x23) {
        Scope::getCompilation((Scope *)local_8);
        Compilation::noteReference
                  ((Compilation *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (Symbol *)in_stack_00000018,SUB81((ulong)in_stack_00000010 >> 0x38,0));
        noteLocation = in_stack_00000018;
      }
    }
    if ((**(int **)local_10 == 0x43) && ((local_11 & 1) != 0)) {
      local_88 = Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)0x64df12);
      pTVar2 = GenericClassDefSymbol::getDefaultSpecialization(this,in_stack_fffffffffffffe90);
      DVar6 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
      *(Type **)local_10 = pTVar2;
      if (*(long *)local_10 == 0) {
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x64df5c);
        if (!bVar1) {
          return;
        }
        local_8c = 0x1b000a;
        pSVar3 = std::optional<slang::SourceRange>::operator*
                           ((optional<slang::SourceRange> *)0x64df99);
        local_a0 = pSVar3->startLoc;
        local_98 = pSVar3->endLoc;
        sourceRange_00.endLoc = in_stack_fffffffffffffe48;
        sourceRange_00.startLoc = in_stack_fffffffffffffe40;
        LookupResult::addDiag
                  (in_stack_fffffffffffffe38,
                   (Scope *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),DVar6,
                   sourceRange_00);
        local_b0 = (local_88->super_Symbol).name._M_len;
        local_a8 = (local_88->super_Symbol).name._M_str;
        arg_00._M_str = in_stack_fffffffffffffe70;
        arg_00._M_len = in_stack_fffffffffffffe68;
        Diagnostic::operator<<(in_stack_fffffffffffffe60,arg_00);
        return;
      }
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x64e022);
    if (bVar1) {
      bitmask<slang::ast::LookupResultFlags>::bitmask(&local_b1,WasImported);
      bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                        ((bitmask<slang::ast::LookupResultFlags> *)in_stack_00000010,
                         (bitmask<slang::ast::LookupResultFlags> *)in_stack_00000008);
      DVar6 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
      if (bVar1) {
        local_c0 = Symbol::getParentScope(*(Symbol **)local_10);
        while (local_c0 != (Scope *)0x0) {
          local_c8 = Scope::asSymbol(local_c0);
          DVar6 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
          if (local_c8->kind == Package) {
            return;
          }
          if (local_c8->kind == AnonymousProgram) {
            Scope::asSymbol((Scope *)local_8);
            bVar1 = isInProgram((Symbol *)noteLocation);
            if (bVar1) {
              return;
            }
            local_d4 = 0xf000a;
            pSVar3 = std::optional<slang::SourceRange>::operator*
                               ((optional<slang::SourceRange> *)0x64e119);
            local_e8 = pSVar3->startLoc;
            local_e0 = pSVar3->endLoc;
            sourceRange_01.endLoc = in_stack_fffffffffffffe48;
            sourceRange_01.startLoc = in_stack_fffffffffffffe40;
            local_d0 = LookupResult::addDiag
                                 (in_stack_fffffffffffffe38,
                                  (Scope *)CONCAT44(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30),DVar6,sourceRange_01)
            ;
            local_ec = 0x50001;
            local_f8 = *(undefined8 *)(*(long *)local_10 + 0x18);
            Diagnostic::addNote(in_stack_00000010,in_stack_fffffffffffffe34,noteLocation);
            return;
          }
          local_c0 = Symbol::getParentScope(local_c8);
        }
      }
      else {
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_f9,IsHierarchical);
        bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                          ((bitmask<slang::ast::LookupResultFlags> *)in_stack_00000010,
                           (bitmask<slang::ast::LookupResultFlags> *)in_stack_00000008);
        if (bVar1) {
          Scope::asSymbol((Scope *)local_8);
          pSVar5 = getContainingPackage((Symbol *)noteLocation);
          if ((pSVar5 != (Symbol *)0x0) &&
             (pSVar4 = getContainingPackage((Symbol *)noteLocation), pSVar4 != pSVar5)) {
            std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x64e277);
            sourceRange_02.endLoc = local_10;
            sourceRange_02.startLoc = in_stack_fffffffffffffe40;
            LookupResult::addDiag
                      (in_stack_fffffffffffffe38,
                       (Scope *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       local_8._4_4_,sourceRange_02);
          }
        }
        else {
          this_02 = Symbol::getParentScope(*(Symbol **)local_10);
          if ((this_02 != (Scope *)0x0) &&
             (pSVar5 = Scope::asSymbol(this_02), pSVar5->kind == CompilationUnit)) {
            Scope::asSymbol((Scope *)local_8);
            pSVar5 = getContainingPackage((Symbol *)noteLocation);
            if (pSVar5 != (Symbol *)0x0) {
              std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x64e349)
              ;
              sourceRange_03.endLoc = in_stack_fffffffffffffe48;
              sourceRange_03.startLoc = local_8;
              LookupResult::addDiag
                        ((LookupResult *)local_10,
                         (Scope *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         DVar6,sourceRange_03);
              Diagnostic::addNote(in_stack_00000010,in_stack_fffffffffffffe34,noteLocation);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void unwrapResult(const Scope& scope, std::optional<SourceRange> range, LookupResult& result,
                  bool unwrapGenericClasses = true) {
    if (!result.found)
        return;

    if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        auto declaredType = result.found->getDeclaredType();
        if (declaredType && declaredType->isEvaluating()) {
            if (range) {
                auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *range);
                diag << result.found->name;
                diag.addNote(diag::NoteDeclarationHere, result.found->location);
            }
            result.found = nullptr;
            return;
        }
    }

    checkVisibility(*result.found, scope, range, result);

    // Unwrap type parameters into their target type alias.
    if (result.found->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*result.found);

        result.found = &result.found->as<TypeParameterSymbol>().getTypeAlias();
        result.flags |= LookupResultFlags::FromTypeParam;
    }
    else if (result.found->kind == SymbolKind::TypeAlias) {
        scope.getCompilation().noteReference(*result.found);
    }

    // If the found symbol is a generic class, unwrap into
    // the default specialization (if possible).
    if (result.found->kind == SymbolKind::GenericClassDef && unwrapGenericClasses) {
        auto& genericClass = result.found->as<GenericClassDefSymbol>();
        result.found = genericClass.getDefaultSpecialization(scope);

        if (!result.found) {
            if (range)
                result.addDiag(scope, diag::NoDefaultSpecialization, *range) << genericClass.name;
            return;
        }
    }

    if (!range)
        return;

    if (result.flags.has(LookupResultFlags::WasImported)) {
        // If the symbol was imported from a package, check if it is actually
        // declared within an anonymous program within that package and if so,
        // check whether we're allowed to reference it from our source scope.
        auto parent = result.found->getParentScope();
        while (parent) {
            auto& parentSym = parent->asSymbol();
            if (parentSym.kind == SymbolKind::Package)
                break;

            if (parentSym.kind == SymbolKind::AnonymousProgram) {
                if (!isInProgram(scope.asSymbol())) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem, *range);
                    diag.addNote(diag::NoteDeclarationHere, result.found->location);
                }
                break;
            }

            parent = parentSym.getParentScope();
        }
    }
    else if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        // Hierarchical references are not allowed from within packages
        // unless the target symbol is also within the same package.
        auto pkg = getContainingPackage(scope.asSymbol());
        if (pkg && getContainingPackage(*result.found) != pkg)
            result.addDiag(scope, diag::HierarchicalFromPackage, *range);
    }
    else if (auto parent = result.found->getParentScope();
             parent && parent->asSymbol().kind == SymbolKind::CompilationUnit) {
        // Compilation unit items are not allowed to be referenced from a package.
        if (getContainingPackage(scope.asSymbol())) {
            auto& diag = result.addDiag(scope, diag::CompilationUnitFromPackage, *range);
            diag.addNote(diag::NoteDeclarationHere, result.found->location);
        }
    }
}